

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityCosseratMesh::SetAsCircularSection
          (ChElasticityCosseratMesh *this,double diameter)

{
  vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  double dVar3;
  int iVar4;
  ChVector2<double> local_48;
  double local_38;
  double local_30;
  
  pCVar1 = (this->vertexes).
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertexes).
      super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    (this->vertexes).
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pCVar1;
  }
  this_00 = &this->vertexes;
  pCVar2 = (this->triangles).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->triangles).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (this->triangles).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  dVar3 = diameter * 0.5;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_48);
  local_48.m_data[1] = 0.0;
  local_48.m_data[0] = dVar3;
  std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
  emplace_back<chrono::ChVector2<double>>
            ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)this_00,
             &local_48);
  iVar4 = 2;
  do {
    local_38 = (double)(int)(iVar4 - 1U) * 0.5235987755982988;
    local_30 = cos(local_38);
    local_30 = local_30 * dVar3;
    local_48.m_data[1] = sin(local_38);
    local_48.m_data[1] = local_48.m_data[1] * dVar3;
    local_48.m_data[0] = local_30;
    std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
    emplace_back<chrono::ChVector2<double>>
              ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
               this_00,&local_48);
    local_48.m_data[0] = (double)((ulong)(iVar4 - 1U) << 0x20);
    local_48.m_data[1] = (double)CONCAT44(local_48.m_data[1]._4_4_,iVar4);
    std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
    emplace_back<chrono::ChVector<int>>
              ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &this->triangles,(ChVector<int> *)&local_48);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0xe);
  return;
}

Assistant:

void ChElasticityCosseratMesh::SetAsCircularSection(double diameter) {
    this->vertexes.clear();
    this->triangles.clear();

    double rad = diameter * 0.5;
    this->vertexes.push_back(ChVector2<>(0, 0));
    this->vertexes.push_back(ChVector2<>(rad, 0));
    int ntri = 12;
    for (int i = 0; i < ntri; ++i) {
        double alpha = (i + 1) * (CH_C_2PI / (double)ntri);
        this->vertexes.push_back(ChVector2<>(rad * cos(alpha), rad * sin(alpha)));
        this->triangles.push_back(ChVector<int>(0, i + 1, i + 2));
    }

    // set Ks using Timoshenko-Gere formula for solid circular shape
    /*
    double poisson = this->E / (2.0 * this->G) - 1.0;
    this->Ks_y = 6.0 * (1.0 + poisson) / (7.0 + 6.0 * poisson);
    this->Ks_z = this->Ks_y;
    */
}